

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_TestTypeRelations_Test::TestBody(TypeTest_TestTypeRelations_Test *this)

{
  HeapType heapType;
  HeapType heapType_00;
  Type a;
  Type lub;
  Type a_00;
  Type a_01;
  Type lub_00;
  Type a_02;
  Type a_03;
  Type a_04;
  Type lub_01;
  Type a_05;
  anon_class_1_0_00000001 *a_06;
  undefined8 uVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar2;
  pointer *__ptr;
  Type in_R8;
  char *in_R9;
  Type TVar3;
  Type a_07;
  Type local_98;
  Type exactSub;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  _Alloc_hider local_78;
  Type nullExactSup;
  undefined8 local_68;
  undefined1 auStack_58 [8];
  Type exactSup;
  byte local_40;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_38;
  Type nullExactSub;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_38,2);
  auStack_58 = (undefined1  [8])0x0;
  exactSup.id = 0;
  ::wasm::TypeBuilder::setOpen((ulong)&local_38,false);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,(Struct *)0x0);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,-(long)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  exactSup.id = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,(Struct *)0x1);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,-(long)auStack_58);
  }
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  ::wasm::TypeBuilder::setSubType(&local_38,1,uVar1,1);
  ::wasm::TypeBuilder::build();
  local_98.id._0_1_ = (internal)(local_40 == 0);
  exactSub.id = 0;
  if ((bool)local_98.id._0_1_) {
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_58);
    heapType.id = ((pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start)->id;
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_58);
    heapType_00.id =
         (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_start[1].id;
    std::__detail::__variant::
    __gen_vtable_impl<std::__detail::__variant::_Multi_array<void_(*)((lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&)>,_std::integer_sequence<unsigned_long,_0UL>_>
    ::__visit_invoke((anon_class_1_0_00000001 *)&stack0xffffffffffffff88,
                     (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_58);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_38);
    if (((uint)(0x7c < heapType.id) * 4 + 3 & (uint)heapType.id) == 0) {
      ::wasm::Type::Type((Type *)auStack_58,heapType,NonNullable,Exact);
      ::wasm::Type::Type((Type *)&stack0xffffffffffffff88,heapType,Nullable,Exact);
      if (((uint)(0x7c < heapType_00.id) * 4 + 3 & (uint)heapType_00.id) == 0) {
        TVar3.id = heapType.id | 2;
        a_07.id = heapType_00.id | 2;
        ::wasm::Type::Type(&local_98,heapType_00,NonNullable,Exact);
        ::wasm::Type::Type((Type *)&local_38,heapType_00,Nullable,Exact);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x20,(Type)0x20,(Type)0x20,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x22,(Type)0x22,(Type)0x20,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)heapType.id,(Type)0x20,
                   (Type)heapType.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,TVar3,(Type)0x22,(Type)heapType.id,in_R8
                  );
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)auStack_58,(Type)0x20,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)local_78._M_p,(Type)0x22,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)heapType_00.id,(Type)0x20,
                   (Type)heapType_00.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,a_07,(Type)0x22,(Type)heapType_00.id,
                   in_R8);
        a.id._1_7_ = local_98.id._1_7_;
        a.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,a,(Type)0x20,a,in_R8);
        lub.id._1_7_ = local_98.id._1_7_;
        lub.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)local_38._M_head_impl,(Type)0x22,
                   lub,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x58,(Type)0x20,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x5a,(Type)0x22,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&DAT_00000020,(Type)0x1,(Type)0x20,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x22,(Type)0x22,(Type)0x22,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)heapType.id,(Type)0x22,(Type)heapType.id,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,TVar3,(Type)0x22,TVar3,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)auStack_58,(Type)0x22,(Type)auStack_58,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)local_78._M_p,(Type)0x22,
                   (Type)local_78._M_p,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)heapType_00.id,(Type)0x22,
                   (Type)heapType_00.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,a_07,(Type)0x22,a_07,in_R8);
        a_00.id._1_7_ = local_98.id._1_7_;
        a_00.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,a_00,(Type)0x22,a_00,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)local_38._M_head_impl,(Type)0x22,
                   (Type)local_38._M_head_impl,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x58,(Type)0x22,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x5a,(Type)0x22,(Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x22,(Type)0x1,(Type)0x22,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)heapType.id,(Type)heapType.id,
                   (Type)heapType.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,TVar3,TVar3,(Type)heapType.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)auStack_58,(Type)heapType.id,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)local_78._M_p,TVar3,(Type)auStack_58
                   ,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)heapType_00.id,(Type)heapType.id,
                   (Type)heapType_00.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,a_07,TVar3,(Type)heapType_00.id,in_R8);
        a_01.id._1_7_ = local_98.id._1_7_;
        a_01.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,a_01,(Type)heapType.id,a_01,in_R8);
        lub_00.id._1_7_ = local_98.id._1_7_;
        lub_00.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)local_38._M_head_impl,TVar3,lub_00,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x58,(Type)heapType.id,(Type)0x58,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x5a,TVar3,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType.id,(Type)0x1,(Type)heapType.id,(Type)0x1,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)TVar3.id,(Type)TVar3.id,(Type)TVar3.id,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)auStack_58,(Type)TVar3.id,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)local_78._M_p,(Type)TVar3.id,
                   (Type)local_78._M_p,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)heapType_00.id,(Type)TVar3.id,
                   (Type)heapType_00.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,a_07,(Type)TVar3.id,a_07,in_R8);
        a_02.id._1_7_ = local_98.id._1_7_;
        a_02.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,a_02,(Type)TVar3.id,a_02,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)local_38._M_head_impl,(Type)TVar3.id,
                   (Type)local_38._M_head_impl,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x58,(Type)TVar3.id,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x5a,(Type)TVar3.id,(Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)TVar3.id,(Type)0x1,(Type)TVar3.id,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)auStack_58,(Type)auStack_58,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)local_78._M_p,(Type)local_78._M_p,
                   (Type)auStack_58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)heapType_00.id,(Type)heapType.id,
                   (Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,a_07,TVar3,(Type)0x58,in_R8);
        a_03.id._1_7_ = local_98.id._1_7_;
        a_03.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,a_03,(Type)heapType.id,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)local_38._M_head_impl,TVar3,
                   (Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x58,(Type)auStack_58,(Type)0x58,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x5a,(Type)local_78._M_p,(Type)0x58,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)auStack_58,(Type)0x1,(Type)auStack_58,(Type)0x1,in_R8)
        ;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)local_78._M_p,(Type)local_78._M_p,
                   (Type)local_78._M_p,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)heapType_00.id,TVar3,(Type)0x58,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,a_07,TVar3,(Type)0x5a,in_R8);
        a_04.id._1_7_ = local_98.id._1_7_;
        a_04.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,a_04,TVar3,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)local_38._M_head_impl,TVar3,
                   (Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x58,(Type)local_78._M_p,
                   (Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x5a,(Type)local_78._M_p,
                   (Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_78._M_p,(Type)0x1,(Type)local_78._M_p,(Type)0x1,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)heapType_00.id,
                   (Type)heapType_00.id,(Type)heapType_00.id,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,a_07,a_07,(Type)heapType_00.id,in_R8);
        TVar3.id._1_7_ = local_98.id._1_7_;
        TVar3.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,TVar3,(Type)heapType_00.id,TVar3,in_R8)
        ;
        lub_01.id._1_7_ = local_98.id._1_7_;
        lub_01.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)local_38._M_head_impl,a_07,lub_01
                   ,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x58,(Type)heapType_00.id,
                   (Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x5a,a_07,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)heapType_00.id,(Type)0x1,(Type)heapType_00.id,
                   (Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)a_07.id,(Type)a_07.id,(Type)a_07.id,
                   in_R8);
        a_05.id._1_7_ = local_98.id._1_7_;
        a_05.id._0_1_ = local_98.id._0_1_;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,a_05,(Type)a_07.id,a_05,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)local_38._M_head_impl,(Type)a_07.id,
                   (Type)local_38._M_head_impl,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x58,(Type)a_07.id,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x5a,(Type)a_07.id,(Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)a_07.id,(Type)0x1,(Type)a_07.id,(Type)0x1,in_R8);
        a_06 = (anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_);
        TestBody::anon_class_1_0_00000001::operator()(a_06,(Type)a_06,(Type)a_06,(Type)a_06,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)local_38._M_head_impl,(Type)local_38._M_head_impl,
                   (Type)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x58,(Type)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x5a,(Type)local_38._M_head_impl,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),
                   (Type)0x1,(Type)CONCAT71(local_98.id._1_7_,local_98.id._0_1_),(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)local_38._M_head_impl,
                   (Type)local_38._M_head_impl,(Type)local_38._M_head_impl,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x58,
                   (Type)local_38._M_head_impl,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x5a,
                   (Type)local_38._M_head_impl,(Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x10,(Type)0x0,(Type)0x1,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x12,(Type)0x0,(Type)0x1,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x2,(Type)0x0,(Type)0x1,
                   in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_38._M_head_impl,(Type)0x1,
                   (Type)local_38._M_head_impl,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x58,(Type)0x58,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x5a,(Type)0x5a,(Type)0x58,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x58,(Type)0x1,(Type)0x58,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x5a,(Type)0x5a,(Type)0x5a,(Type)0x5a,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x5a,(Type)0x10,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x5a,(Type)0x12,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x5a,(Type)0x2,(Type)0x0,(Type)0x1,in_R8);
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x5a,(Type)0x1,(Type)0x5a,(Type)0x1,in_R8);
        return;
      }
    }
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&stack0xffffffffffffff88,(internal *)&local_98,(AssertionResult *)"built",
             "false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
             ,0x4bb,local_78._M_p);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if (local_78._M_p != (pointer)&stack0xffffffffffffff98) {
    operator_delete(local_78._M_p,local_68 + 1);
  }
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  if (exactSub.id != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&exactSub,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exactSub.id);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_40]._M_data)
            ((anon_class_1_0_00000001 *)&stack0xffffffffffffff88,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)auStack_58);
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_38);
  return;
}

Assistant:

TEST_F(TypeTest, TestTypeRelations) {
  HeapType definedSuper, definedSub;
  {
    TypeBuilder builder(2);
    builder[0].setOpen() = Struct();
    builder[1] = Struct();
    builder[1].subTypeOf(builder[0]);
    auto built = builder.build();
    ASSERT_TRUE(built);
    definedSuper = (*built)[0];
    definedSub = (*built)[1];
  }

  Type any = Type(HeapType::any, NonNullable, Inexact);
  Type nullAny = Type(HeapType::any, Nullable, Inexact);

  Type sup = Type(definedSuper, NonNullable, Inexact);
  Type nullSup = Type(definedSuper, Nullable, Inexact);
  Type exactSup = Type(definedSuper, NonNullable, Exact);
  Type nullExactSup = Type(definedSuper, Nullable, Exact);

  Type sub = Type(definedSub, NonNullable, Inexact);
  Type nullSub = Type(definedSub, Nullable, Inexact);
  Type exactSub = Type(definedSub, NonNullable, Exact);
  Type nullExactSub = Type(definedSub, Nullable, Exact);

  Type none = Type(HeapType::none, NonNullable, Inexact);
  Type nullNone = Type(HeapType::none, Nullable, Inexact);

  Type func = Type(HeapType::func, NonNullable, Inexact);
  Type nullFunc = Type(HeapType::func, Nullable, Inexact);

  Type i32 = Type::i32;
  Type unreachable = Type::unreachable;

  auto assertLUB = [](Type a, Type b, Type lub, Type glb) {
    auto lub1 = Type::getLeastUpperBound(a, b);
    auto lub2 = Type::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (lub != Type::none) {
      EXPECT_TRUE(Type::isSubType(a, lub));
      EXPECT_TRUE(Type::isSubType(b, lub));
    }
    auto glb1 = Type::getGreatestLowerBound(a, b);
    auto glb2 = Type::getGreatestLowerBound(b, a);
    EXPECT_EQ(glb, glb1);
    EXPECT_EQ(glb, glb2);
    EXPECT_TRUE(Type::isSubType(glb, a));
    EXPECT_TRUE(Type::isSubType(glb, b));
    if (a == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(lub, a);
      EXPECT_EQ(glb, a);
    } else if (lub == b) {
      EXPECT_TRUE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_EQ(glb, a);
    } else if (lub == a) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_TRUE(Type::isSubType(b, a));
      EXPECT_EQ(glb, b);
    } else if (lub != Type::none) {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
      EXPECT_NE(glb, a);
      EXPECT_NE(glb, b);
    } else {
      EXPECT_FALSE(Type::isSubType(a, b));
      EXPECT_FALSE(Type::isSubType(b, a));
    }

    if (a.isRef() && b.isRef()) {
      auto htA = a.getHeapType();
      auto htB = b.getHeapType();

      if (lub == Type::none) {
        EXPECT_NE(htA.getTop(), htB.getTop());
        EXPECT_NE(htA.getBottom(), htB.getBottom());
      } else {
        EXPECT_EQ(htA.getTop(), htB.getTop());
        EXPECT_EQ(htA.getBottom(), htB.getBottom());
      }
    }
  };

  assertLUB(any, any, any, any);
  assertLUB(any, nullAny, nullAny, any);
  assertLUB(any, sup, any, sup);
  assertLUB(any, nullSup, nullAny, sup);
  assertLUB(any, exactSup, any, exactSup);
  assertLUB(any, nullExactSup, nullAny, exactSup);
  assertLUB(any, sub, any, sub);
  assertLUB(any, nullSub, nullAny, sub);
  assertLUB(any, exactSub, any, exactSub);
  assertLUB(any, nullExactSub, nullAny, exactSub);
  assertLUB(any, none, any, none);
  assertLUB(any, nullNone, nullAny, none);
  assertLUB(any, func, Type(Type::none), unreachable);
  assertLUB(any, nullFunc, Type(Type::none), unreachable);
  assertLUB(any, i32, Type(Type::none), unreachable);
  assertLUB(any, unreachable, any, unreachable);

  assertLUB(nullAny, nullAny, nullAny, nullAny);
  assertLUB(nullAny, sup, nullAny, sup);
  assertLUB(nullAny, nullSup, nullAny, nullSup);
  assertLUB(nullAny, exactSup, nullAny, exactSup);
  assertLUB(nullAny, nullExactSup, nullAny, nullExactSup);
  assertLUB(nullAny, sub, nullAny, sub);
  assertLUB(nullAny, nullSub, nullAny, nullSub);
  assertLUB(nullAny, exactSub, nullAny, exactSub);
  assertLUB(nullAny, nullExactSub, nullAny, nullExactSub);
  assertLUB(nullAny, none, nullAny, none);
  assertLUB(nullAny, nullNone, nullAny, nullNone);
  assertLUB(nullAny, func, Type(Type::none), unreachable);
  assertLUB(nullAny, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullAny, i32, Type(Type::none), unreachable);
  assertLUB(nullAny, unreachable, nullAny, unreachable);

  assertLUB(sup, sup, sup, sup);
  assertLUB(sup, nullSup, nullSup, sup);
  assertLUB(sup, exactSup, sup, exactSup);
  assertLUB(sup, nullExactSup, nullSup, exactSup);
  assertLUB(sup, sub, sup, sub);
  assertLUB(sup, nullSub, nullSup, sub);
  assertLUB(sup, exactSub, sup, exactSub);
  assertLUB(sup, nullExactSub, nullSup, exactSub);
  assertLUB(sup, none, sup, none);
  assertLUB(sup, nullNone, nullSup, none);
  assertLUB(sup, func, Type(Type::none), unreachable);
  assertLUB(sup, nullFunc, Type(Type::none), unreachable);
  assertLUB(sup, i32, Type(Type::none), unreachable);
  assertLUB(sup, unreachable, sup, unreachable);

  assertLUB(nullSup, nullSup, nullSup, nullSup);
  assertLUB(nullSup, exactSup, nullSup, exactSup);
  assertLUB(nullSup, nullExactSup, nullSup, nullExactSup);
  assertLUB(nullSup, sub, nullSup, sub);
  assertLUB(nullSup, nullSub, nullSup, nullSub);
  assertLUB(nullSup, exactSub, nullSup, exactSub);
  assertLUB(nullSup, nullExactSub, nullSup, nullExactSub);
  assertLUB(nullSup, none, nullSup, none);
  assertLUB(nullSup, nullNone, nullSup, nullNone);
  assertLUB(nullSup, func, Type(Type::none), unreachable);
  assertLUB(nullSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSup, i32, Type(Type::none), unreachable);
  assertLUB(nullSup, unreachable, nullSup, unreachable);

  assertLUB(exactSup, exactSup, exactSup, exactSup);
  assertLUB(exactSup, nullExactSup, nullExactSup, exactSup);
  assertLUB(exactSup, sub, sup, none);
  assertLUB(exactSup, nullSub, nullSup, none);
  assertLUB(exactSup, exactSub, sup, none);
  assertLUB(exactSup, nullExactSub, nullSup, none);
  assertLUB(exactSup, none, exactSup, none);
  assertLUB(exactSup, nullNone, nullExactSup, none);
  assertLUB(exactSup, func, Type(Type::none), unreachable);
  assertLUB(exactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSup, i32, Type(Type::none), unreachable);
  assertLUB(exactSup, unreachable, exactSup, unreachable);

  assertLUB(nullExactSup, nullExactSup, nullExactSup, nullExactSup);
  assertLUB(nullExactSup, sub, nullSup, none);
  assertLUB(nullExactSup, nullSub, nullSup, nullNone);
  assertLUB(nullExactSup, exactSub, nullSup, none);
  assertLUB(nullExactSup, nullExactSub, nullSup, nullNone);
  assertLUB(nullExactSup, none, nullExactSup, none);
  assertLUB(nullExactSup, nullNone, nullExactSup, nullNone);
  assertLUB(nullExactSup, func, Type(Type::none), unreachable);
  assertLUB(nullExactSup, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSup, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSup, unreachable, nullExactSup, unreachable);

  assertLUB(sub, sub, sub, sub);
  assertLUB(sub, nullSub, nullSub, sub);
  assertLUB(sub, exactSub, sub, exactSub);
  assertLUB(sub, nullExactSub, nullSub, exactSub);
  assertLUB(sub, none, sub, none);
  assertLUB(sub, nullNone, nullSub, none);
  assertLUB(sub, func, Type(Type::none), unreachable);
  assertLUB(sub, nullFunc, Type(Type::none), unreachable);
  assertLUB(sub, i32, Type(Type::none), unreachable);
  assertLUB(sub, unreachable, sub, unreachable);

  assertLUB(nullSub, nullSub, nullSub, nullSub);
  assertLUB(nullSub, exactSub, nullSub, exactSub);
  assertLUB(nullSub, nullExactSub, nullSub, nullExactSub);
  assertLUB(nullSub, none, nullSub, none);
  assertLUB(nullSub, nullNone, nullSub, nullNone);
  assertLUB(nullSub, func, Type(Type::none), unreachable);
  assertLUB(nullSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullSub, i32, Type(Type::none), unreachable);
  assertLUB(nullSub, unreachable, nullSub, unreachable);

  assertLUB(exactSub, exactSub, exactSub, exactSub);
  assertLUB(exactSub, nullExactSub, nullExactSub, exactSub);
  assertLUB(exactSub, none, exactSub, none);
  assertLUB(exactSub, nullNone, nullExactSub, none);
  assertLUB(exactSub, func, Type(Type::none), unreachable);
  assertLUB(exactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(exactSub, i32, Type(Type::none), unreachable);
  assertLUB(exactSub, unreachable, exactSub, unreachable);

  assertLUB(nullExactSub, nullExactSub, nullExactSub, nullExactSub);
  assertLUB(nullExactSub, none, nullExactSub, none);
  assertLUB(nullExactSub, nullNone, nullExactSub, nullNone);
  assertLUB(nullExactSub, func, Type(Type::none), unreachable);
  assertLUB(nullExactSub, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullExactSub, i32, Type(Type::none), unreachable);
  assertLUB(nullExactSub, unreachable, nullExactSub, unreachable);

  assertLUB(none, none, none, none);
  assertLUB(none, nullNone, nullNone, none);
  assertLUB(none, func, Type(Type::none), unreachable);
  assertLUB(none, nullFunc, Type(Type::none), unreachable);
  assertLUB(none, i32, Type(Type::none), unreachable);
  assertLUB(none, unreachable, none, unreachable);

  assertLUB(nullNone, nullNone, nullNone, nullNone);
  assertLUB(nullNone, func, Type(Type::none), unreachable);
  assertLUB(nullNone, nullFunc, Type(Type::none), unreachable);
  assertLUB(nullNone, i32, Type(Type::none), unreachable);
  assertLUB(nullNone, unreachable, nullNone, unreachable);
}